

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControl::drawContents(QWidgetTextControl *this,QPainter *p,QRectF *rect,QWidget *widget)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  PaintContext *pPVar5;
  long in_FS_OFFSET;
  byte bVar6;
  PaintContext ctx;
  
  bVar6 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::save();
  puVar4 = &DAT_00668088;
  pPVar5 = &ctx;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pPVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    pPVar5 = (PaintContext *)((long)pPVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  getPaintContext(&ctx,this,widget);
  if ((0.0 < rect->w) && (0.0 < rect->h)) {
    QPainter::setClipRect((QRectF *)p,(ClipOperation)rect);
  }
  ctx.clip.xp = rect->xp;
  ctx.clip.yp = rect->yp;
  ctx.clip.w = rect->w;
  ctx.clip.h = rect->h;
  plVar2 = (long *)QTextDocument::documentLayout();
  (**(code **)(*plVar2 + 0x60))(plVar2,p,&ctx);
  QPainter::restore();
  QAbstractTextDocumentLayout::PaintContext::~PaintContext(&ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::drawContents(QPainter *p, const QRectF &rect, QWidget *widget)
{
    Q_D(QWidgetTextControl);
    p->save();
    QAbstractTextDocumentLayout::PaintContext ctx = getPaintContext(widget);
    if (rect.isValid())
        p->setClipRect(rect, Qt::IntersectClip);
    ctx.clip = rect;

    d->doc->documentLayout()->draw(p, ctx);
    p->restore();
}